

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

bool CoreML::hasIOS13NeuralNetworkFeatures(Model *model)

{
  uint32 uVar1;
  bool bVar2;
  NeuralNetwork *pNVar3;
  NeuralNetworkRegressor *pNVar4;
  NeuralNetworkClassifier *pNVar5;
  RepeatedPtrFieldBase *this;
  Type *layer;
  bool bVar6;
  int i;
  int index;
  
  uVar1 = model->_oneof_case_[0];
  if (uVar1 == 0x12f) {
LAB_0021d082:
    pNVar4 = Specification::Model::neuralnetworkregressor(model);
    if (pNVar4->arrayinputshapemapping_ != 0) {
      return true;
    }
    pNVar4 = Specification::Model::neuralnetworkregressor(model);
    if (pNVar4->imageinputshapemapping_ != 0) {
      return true;
    }
  }
  else if (uVar1 != 0x193) {
    if (uVar1 != 500) goto LAB_0021d0be;
    pNVar3 = Specification::Model::neuralnetwork(model);
    if (pNVar3->arrayinputshapemapping_ != 0) {
      return true;
    }
    pNVar3 = Specification::Model::neuralnetwork(model);
    if (pNVar3->imageinputshapemapping_ != 0) {
      return true;
    }
    goto LAB_0021d082;
  }
  pNVar5 = Specification::Model::neuralnetworkclassifier(model);
  if (pNVar5->arrayinputshapemapping_ != 0) {
    return true;
  }
  pNVar5 = Specification::Model::neuralnetworkclassifier(model);
  if (pNVar5->imageinputshapemapping_ != 0) {
    return true;
  }
LAB_0021d0be:
  this = &getNNSpec(model)->super_RepeatedPtrFieldBase;
  index = 0;
  if (this == (RepeatedPtrFieldBase *)0x0) {
    bVar6 = false;
  }
  else {
    do {
      bVar6 = index < this->current_size_;
      if (this->current_size_ <= index) {
        return bVar6;
      }
      layer = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                        (this,index);
      bVar2 = isIOS12NeuralNetworkLayer(layer);
      index = index + 1;
    } while (bVar2);
  }
  return bVar6;
}

Assistant:

bool CoreML::hasIOS13NeuralNetworkFeatures(const Specification::Model& model) {

    /* check if any of the messages in NeuralNetwork.proto, that were added in iOS version 13, are being used.
      If they are, return True, otherwise return False.

     In particular, check for the presence of the following messages:
     1. any new layer type, which was not in iOS 12.
     2. if the value of enums "NeuralNetworkMultiArrayShapeMapping" or "NeuralNetworkImageShapeMapping" is non 0
     */

    switch (model.Type_case()) {
        case Specification::Model::TypeCase::kNeuralNetwork:
            if (model.neuralnetwork().arrayinputshapemapping() != Specification::NeuralNetworkMultiArrayShapeMapping::RANK5_ARRAY_MAPPING) {
                return true;
            }
            if (model.neuralnetwork().imageinputshapemapping() != Specification::NeuralNetworkImageShapeMapping::RANK5_IMAGE_MAPPING) {
                return true;
            }
        case Specification::Model::TypeCase::kNeuralNetworkRegressor:
            if (model.neuralnetworkregressor().arrayinputshapemapping() != Specification::NeuralNetworkMultiArrayShapeMapping::RANK5_ARRAY_MAPPING) {
                return true;
            }
            if (model.neuralnetworkregressor().imageinputshapemapping() != Specification::NeuralNetworkImageShapeMapping::RANK5_IMAGE_MAPPING) {
                return true;
            }
        case Specification::Model::TypeCase::kNeuralNetworkClassifier:
            if (model.neuralnetworkclassifier().arrayinputshapemapping() != Specification::NeuralNetworkMultiArrayShapeMapping::RANK5_ARRAY_MAPPING) {
                return true;
            }
            if (model.neuralnetworkclassifier().imageinputshapemapping() != Specification::NeuralNetworkImageShapeMapping::RANK5_IMAGE_MAPPING) {
                return true;
            }
        default:
            break;
    }

    // check for new layers: by checking if its NOT one of the layers supported in iOS 12
    auto layers = getNNSpec(model);
    if (layers) {
        for (int i=0; i< layers->size(); i++){
            const Specification::NeuralNetworkLayer& layer = (*layers)[i];
            if (!isIOS12NeuralNetworkLayer(layer)) {
                return true;
            }
        }
    }

    return false;
}